

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type __thiscall
duckdb::Deserializer::
Read<duckdb::unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>,duckdb::ExtensionTypeInfo>
          (Deserializer *this)

{
  long *in_RSI;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_> in_RDI;
  bool is_present;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true> *ptr;
  nullptr_t in_stack_ffffffffffffffa8;
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> this_00;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  local_30 [3];
  byte local_12;
  undefined1 local_11;
  
  local_11 = 0;
  this_00._M_head_impl =
       (ExtensionTypeInfo *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
       .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl;
  unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>::
  unique_ptr<std::default_delete<duckdb::ExtensionTypeInfo>,void>
            ((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
              *)in_RDI._M_t.
                super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl,
             in_stack_ffffffffffffffa8);
  local_12 = (**(code **)(*in_RSI + 0x50))();
  local_12 = local_12 & 1;
  if (local_12 != 0) {
    (**(code **)(*in_RSI + 0x30))();
    ExtensionTypeInfo::Deserialize(this);
    unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
    operator=((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
               *)this_00._M_head_impl,local_30);
    unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
                 *)0xb6b2f5);
    (**(code **)(*in_RSI + 0x38))();
  }
  (**(code **)(*in_RSI + 0x58))();
  return (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         (__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
           .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl;
}

Assistant:

inline typename std::enable_if<is_unique_ptr<T>::value && has_deserialize<ELEMENT_TYPE>::value, T>::type Read() {
		unique_ptr<ELEMENT_TYPE> ptr = nullptr;
		auto is_present = OnNullableBegin();
		if (is_present) {
			OnObjectBegin();
			ptr = ELEMENT_TYPE::Deserialize(*this);
			OnObjectEnd();
		}
		OnNullableEnd();
		return ptr;
	}